

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O2

bool __thiscall
ON_Viewport::GetBoundingBoxProjectionExtents
          (ON_Viewport *this,ON_BoundingBox bbox,ON_Interval *x_extents,ON_Interval *y_extents)

{
  undefined1 auVar1 [16];
  ON_3dPoint from_pt;
  ON_PlaneEquation e_00;
  ON_PlaneEquation e_01;
  ON_PlaneEquation e_02;
  ON_3dPoint to_pt;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  double *pdVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int j;
  int iVar10;
  int iVar11;
  ON_PlaneEquation *this_00;
  uint uVar13;
  double dVar14;
  ON_3dPoint clipping_point;
  double local_520;
  double local_518;
  ON_3dPoint local_4f0;
  double t;
  double dStack_4d0;
  double local_4c8;
  ON_3dPoint OStack_4c0;
  ON_BoundingBox clipping_bbox;
  ON_3dPoint cam_loc;
  ON_PlaneEquation vp_far_plane;
  ON_PlaneEquation vp_near_plane;
  ON_Interval unit_interval;
  ON_3dPoint P;
  double dStack_3f0;
  ON_PlaneEquation local_3e8;
  ON_PlaneEquation local_3c8;
  ON_PlaneEquation local_3a8;
  ON_3dPoint far_rect [4];
  ON_Line camera_ray;
  ON_3dPoint bbox_point;
  ON_PlaneEquation e;
  double adStack_258 [69];
  ON_BoundingBox *pOVar5;
  ON_BoundingBox *pOVar12;
  
  ON_Interval::ON_Interval(&unit_interval,0.0,1.0);
  x_extents->m_t[0] = unit_interval.m_t[0];
  x_extents->m_t[1] = unit_interval.m_t[1];
  y_extents->m_t[0] = unit_interval.m_t[0];
  y_extents->m_t[1] = unit_interval.m_t[1];
  bVar2 = ON_BoundingBox::IsValid(&bbox);
  if ((!bVar2) || ((this->m_bValidCamera == false && (this->m_bValidFrustum != true)))) {
    return false;
  }
  cam_loc.z = (this->m_CamLoc).z;
  cam_loc.x = (this->m_CamLoc).x;
  cam_loc.y = (this->m_CamLoc).y;
  bVar2 = ON_3dPoint::IsValid(&cam_loc);
  if (!bVar2) {
    return false;
  }
  bVar2 = GetFarRect(this,far_rect,far_rect + 1,far_rect + 3,far_rect + 2);
  if (!bVar2) {
    return false;
  }
  ON_3dPoint::ON_3dPoint(&clipping_point,-1.23432101234321e+308,-1.23432101234321e+308,0.0);
  ON_BoundingBox::ON_BoundingBox(&clipping_bbox);
  clipping_bbox.m_min.z = clipping_point.z;
  clipping_bbox.m_max.z = clipping_point.z;
  from_pt.y = cam_loc.y;
  from_pt.x = cam_loc.x;
  from_pt.z = cam_loc.z;
  to_pt.y = ON_3dPoint::UnsetPoint.y;
  to_pt.x = ON_3dPoint::UnsetPoint.x;
  to_pt.z = ON_3dPoint::UnsetPoint.z;
  ON_Line::ON_Line(&camera_ray,from_pt,to_pt);
  pOVar5 = &bbox;
  for (uVar8 = 0; uVar8 != 4; uVar8 = uVar8 + 1) {
    camera_ray.to.z = far_rect[uVar8].z;
    camera_ray.to.x = far_rect[uVar8].x;
    camera_ray.to.y = far_rect[uVar8].y;
    uVar4 = (int)uVar8 - 1;
    pOVar5 = (ON_BoundingBox *)(ulong)uVar4;
    local_518 = 1.0;
    if (1 < uVar4) {
      local_518 = -1.0;
    }
    local_520 = 1.0;
    if (uVar8 < 2) {
      local_520 = -1.0;
    }
    for (iVar10 = 0; iVar10 != 3; iVar10 = iVar10 + 1) {
      uVar4 = 0x3ff00000;
      if (iVar10 != 0) {
        uVar4 = 0;
      }
      uVar13 = 0x3ff00000;
      if (iVar10 != 1) {
        uVar13 = 0;
      }
      dVar14 = 1.0;
      if (iVar10 != 2) {
        dVar14 = 0.0;
      }
      ON_PlaneEquation::ON_PlaneEquation
                (&e,(double)((ulong)uVar4 << 0x20),(double)((ulong)uVar13 << 0x20),dVar14,0.0);
      pOVar5 = (ON_BoundingBox *)0x2;
      while( true ) {
        iVar11 = (int)pOVar5;
        pOVar12 = (ON_BoundingBox *)(ulong)(iVar11 - 1);
        if (iVar11 == 0) break;
        pOVar5 = (ON_BoundingBox *)&bbox.m_max;
        if (iVar11 == 2) {
          pOVar5 = &bbox;
        }
        bbox_point.z = (pOVar5->m_min).z;
        bbox_point.x = (pOVar5->m_min).x;
        bbox_point.y = (pOVar5->m_min).y;
        e.d = 0.0;
        pdVar6 = ON_3dPoint::operator[](&bbox_point,iVar10);
        e.d = -*pdVar6;
        t = -1.23432101234321e+308;
        bVar2 = ON_Intersect(&camera_ray,&e,&t);
        pOVar5 = pOVar12;
        if (bVar2 && 0.0 < t) {
          ON_Line::PointAt(&P,&camera_ray,t);
          pdVar6 = ON_3dPoint::operator[](&bbox_point,iVar10);
          dVar14 = *pdVar6;
          pdVar6 = ON_3dPoint::operator[](&P,iVar10);
          *pdVar6 = dVar14;
          bVar2 = ON_BoundingBox::IsPointIn(&bbox,&P,0);
          if (bVar2) {
            clipping_point.x = local_518;
            clipping_point.y = local_520;
            ON_BoundingBox::Set(&clipping_bbox,&clipping_point,1);
          }
        }
      }
    }
  }
  auVar1._4_4_ = -(uint)(clipping_bbox.m_min.y != -1.0);
  auVar1._0_4_ = -(uint)(clipping_bbox.m_min.x != -1.0);
  auVar1._8_4_ = -(uint)(clipping_bbox.m_max.x != 1.0);
  auVar1._12_4_ = -(uint)(clipping_bbox.m_max.y != 1.0);
  iVar10 = movmskps((int)pOVar5,auVar1);
  if (iVar10 == 0) {
LAB_00669a42:
    bVar2 = ON_BoundingBox::IsValid(&clipping_bbox);
    if (bVar2) {
      this_00 = &e;
      ON_Interval::ON_Interval((ON_Interval *)this_00);
      ON_Interval::ON_Interval((ON_Interval *)&e.z);
      for (lVar9 = 0; bVar2 = lVar9 == 2, !bVar2; lVar9 = lVar9 + 1) {
        pdVar6 = ON_3dPoint::operator[](&clipping_bbox.m_min,(int)lVar9);
        dVar14 = *pdVar6;
        pdVar6 = ON_3dPoint::operator[](&clipping_bbox.m_max,(int)lVar9);
        ON_Interval::Set((ON_Interval *)this_00,(dVar14 + 1.0) * 0.5,(*pdVar6 + 1.0) * 0.5);
        bVar3 = ON_Interval::IsIncreasing((ON_Interval *)this_00);
        if ((((!bVar3) && (bVar3 = ON_Interval::IsSingleton((ON_Interval *)this_00), !bVar3)) ||
            ((bVar3 = ON_Interval::Intersection((ON_Interval *)this_00,&unit_interval), !bVar3 ||
             (bVar3 = ON_Interval::IsValid((ON_Interval *)this_00), !bVar3)))) ||
           ((bVar3 = ON_Interval::IsIncreasing((ON_Interval *)this_00), !bVar3 &&
            (bVar3 = ON_Interval::IsSingleton((ON_Interval *)this_00), !bVar3)))) goto LAB_00669b47;
        this_00 = (ON_PlaneEquation *)&this_00->z;
      }
      x_extents->m_t[0] = e.x;
      x_extents->m_t[1] = e.y;
      y_extents->m_t[0] = e.z;
      y_extents->m_t[1] = e.d;
      goto LAB_00669b47;
    }
  }
  else {
    ON_Xform::ON_Xform((ON_Xform *)&bbox_point);
    bVar2 = GetXform(this,world_cs,clip_cs,(ON_Xform *)&bbox_point);
    if (bVar2) {
      ON_PlaneEquation::ON_PlaneEquation(&vp_near_plane);
      bVar2 = GetNearPlaneEquation(this,&vp_near_plane);
      if (bVar2) {
        ON_PlaneEquation::ON_PlaneEquation(&vp_far_plane);
        bVar2 = GetFarPlaneEquation(this,&vp_far_plane);
        if (bVar2) {
          lVar9 = 0;
          do {
            ON_PlaneEquation::ON_PlaneEquation((ON_PlaneEquation *)((long)&P.x + lVar9));
            lVar9 = lVar9 + 0x20;
          } while (lVar9 != 0x80);
          bVar2 = GetFrustumLeftPlaneEquation(this,(ON_PlaneEquation *)&P);
          if ((((bVar2) && (bVar2 = GetFrustumBottomPlaneEquation(this,&local_3e8), bVar2)) &&
              (bVar2 = GetFrustumRightPlaneEquation(this,&local_3c8), bVar2)) &&
             (bVar2 = GetFrustumTopPlaneEquation(this,&local_3a8), bVar2)) {
            lVar9 = 0;
            do {
              ON_Line::ON_Line((ON_Line *)((long)&e.x + lVar9));
              lVar9 = lVar9 + 0x30;
            } while (lVar9 != 0x240);
            ON_BoundingBox::GetEdges(&bbox,(ON_Line *)&e);
            for (lVar9 = 0; lVar9 != 0xc; lVar9 = lVar9 + 1) {
              lVar7 = lVar9 * 0x30;
              t = *(double *)((long)&e + lVar7);
              dStack_4d0 = *(double *)((long)&e + lVar7 + 8);
              local_4c8 = *(double *)((long)&e + lVar7 + 0x10);
              OStack_4c0.x = *(double *)((long)&e + lVar7 + 0x18);
              OStack_4c0.y = adStack_258[lVar9 * 6];
              OStack_4c0.z = adStack_258[lVar9 * 6 + 1];
              e_00.y = vp_near_plane.y;
              e_00.x = vp_near_plane.x;
              e_00.z = vp_near_plane.z;
              e_00.d = vp_near_plane.d;
              bVar2 = TrimLineHelper(e_00,true,(ON_Line *)&t);
              if ((bVar2) &&
                 (e_01.y = vp_far_plane.y, e_01.x = vp_far_plane.x, e_01.z = vp_far_plane.z,
                 e_01.d = vp_far_plane.d, bVar2 = TrimLineHelper(e_01,false,(ON_Line *)&t), bVar2))
              {
                lVar7 = 0;
                do {
                  if (lVar7 + 0x20 == 0xa0) goto LAB_0066997b;
                  e_02.y = (double)*(undefined8 *)((long)&P.y + lVar7);
                  e_02.x = (double)*(undefined8 *)((long)&P.x + lVar7);
                  e_02.z = (double)*(undefined8 *)((long)&P.z + lVar7);
                  e_02.d = *(double *)((long)&dStack_3f0 + lVar7);
                  bVar2 = TrimLineHelper(e_02,false,(ON_Line *)&t);
                  lVar7 = lVar7 + 0x20;
                } while (bVar2);
                local_4c8 = ON_3dPoint::UnsetPoint.z;
                t = ON_3dPoint::UnsetPoint.x;
                dStack_4d0 = ON_3dPoint::UnsetPoint.y;
                OStack_4c0.z = ON_3dPoint::UnsetPoint.z;
                OStack_4c0.x = ON_3dPoint::UnsetPoint.x;
                OStack_4c0.y = ON_3dPoint::UnsetPoint.y;
LAB_0066997b:
                bVar2 = ON_Line::IsValid((ON_Line *)&t);
                if (bVar2) {
                  ON_Xform::operator*(&local_4f0,(ON_Xform *)&bbox_point,(ON_3dPoint *)&t);
                  clipping_point.z = local_4f0.z;
                  clipping_point.x = local_4f0.x;
                  clipping_point.y = local_4f0.y;
                  ON_BoundingBox::Set(&clipping_bbox,&clipping_point,1);
                  ON_Xform::operator*(&local_4f0,(ON_Xform *)&bbox_point,&OStack_4c0);
                  clipping_point.z = local_4f0.z;
                  clipping_point.x = local_4f0.x;
                  clipping_point.y = local_4f0.y;
                  ON_BoundingBox::Set(&clipping_bbox,&clipping_point,1);
                }
              }
              ON_Line::~ON_Line((ON_Line *)&t);
            }
            lVar9 = 0x210;
            do {
              ON_Line::~ON_Line((ON_Line *)((long)&e.x + lVar9));
              lVar9 = lVar9 + -0x30;
            } while (lVar9 != -0x30);
            goto LAB_00669a42;
          }
        }
      }
    }
  }
  bVar2 = false;
LAB_00669b47:
  ON_Line::~ON_Line(&camera_ray);
  return bVar2;
}

Assistant:

bool ON_Viewport::GetBoundingBoxProjectionExtents(
    ON_BoundingBox bbox,
    ON_Interval& x_extents,
    ON_Interval& y_extents
    ) const
{
  const ON_Interval unit_interval(0.0,1.0);
  x_extents = unit_interval;
  y_extents = unit_interval;

  if ( !bbox.IsValid() )
    return false;

  if ( !IsValidCamera() && !IsValidFrustum() )
    return false;

  const ON_3dPoint cam_loc = CameraLocation();
  if ( !cam_loc.IsValid() )
    return false;

  // far_rect[] points run image ccw 
  // (image lower left, lower right, upper right, upper left)
  ON_3dPoint far_rect[4];
  if ( !GetFarRect(far_rect[0],far_rect[1],far_rect[3],far_rect[2]) )
    return false;

  ON_3dPoint clipping_point(ON_UNSET_VALUE,ON_UNSET_VALUE,0.0);
  ON_BoundingBox clipping_bbox;
  clipping_bbox.m_min.z = clipping_point.z;
  clipping_bbox.m_max.z = clipping_point.z;

  ON_Line camera_ray(cam_loc,ON_3dPoint::UnsetPoint);
  for ( int i = 0; i < 4; i++ )
  {
    camera_ray.to = far_rect[i];
    for ( int j = 0; j < 3; j++ )
    {
      ON_PlaneEquation e(0==j ? 1.0 : 0.0, 1 == j ? 1.0 : 0.0, 2==j?1.0:0.0, 0.0);
      for ( int k = 0; k < 2; k++ )
      {
        ON_3dPoint bbox_point = k ? bbox.m_max : bbox.m_min;
        e.d = 0.0;
        e.d = -bbox_point[j];
        double t = ON_UNSET_VALUE;
        if ( ON_Intersect(camera_ray,e,&t) )
        {
          if ( t > 0.0 )
          {
            ON_3dPoint P = camera_ray.PointAt(t);
            P[j] = bbox_point[j];
            if ( bbox.IsPointIn(P) )
            {
              clipping_point.x = (1 == i || 2 == i) ? 1.0 : -1.0;
              clipping_point.y = (i >= 2) ? 1.0 : -1.0;
              clipping_bbox.Set(clipping_point,true);
            }
          }
        }
      }
    }
  }

  if (    clipping_bbox.m_min.x != -1.0 || clipping_bbox.m_min.y != -1.0
       || clipping_bbox.m_max.x !=  1.0 || clipping_bbox.m_max.y !=  1.0
     )
  {
    ON_Xform w2c;
    if ( !GetXform(ON::world_cs,ON::clip_cs,w2c) )
      return false;

    ON_PlaneEquation vp_near_plane;
    if ( !GetNearPlaneEquation(vp_near_plane) )
      return false;

    ON_PlaneEquation vp_far_plane;
    if ( !GetFarPlaneEquation(vp_far_plane) )
      return false;

    ON_PlaneEquation frustum_sides[4];
    if ( !GetFrustumLeftPlaneEquation(frustum_sides[0]) )
      return false;
    if ( !GetFrustumBottomPlaneEquation(frustum_sides[1]) )
      return false;
    if ( !GetFrustumRightPlaneEquation(frustum_sides[2]) )
      return false;
    if ( !GetFrustumTopPlaneEquation(frustum_sides[3]) )
      return false;

    ON_Line bbox_lines[12];
    bbox.GetEdges(bbox_lines);

    for ( int i = 0; i < 12; i++ )
    {
      ON_Line line = bbox_lines[i];

      if ( !TrimLineHelper( vp_near_plane, true, line ) )
        continue;

      if ( !TrimLineHelper( vp_far_plane, false, line ) )
        continue;

      for ( int j = 0; j < 4; j++ )
      {
        if ( !TrimLineHelper(frustum_sides[j],false,line) )
        {
          line.from = ON_3dPoint::UnsetPoint;
          line.to = ON_3dPoint::UnsetPoint;
          break;
        }
      }

      if ( !line.IsValid() )
        continue;      

      clipping_point = w2c*line.from;
      clipping_bbox.Set(clipping_point,true);

      clipping_point = w2c*line.to;
      clipping_bbox.Set(clipping_point,true);
    }
  }

  bool rc = clipping_bbox.IsValid();

  if ( rc )
  {
    ON_Interval extents[2];
    for ( int i = 0; i < 2; i++ )
    {
      extents[i].Set( 
        0.5*(clipping_bbox.m_min[i]+1.0),
        0.5*(clipping_bbox.m_max[i]+1.0)
        );    
      
      if ( extents[i].IsIncreasing() || extents[i].IsSingleton() )
      {
        if ( extents[i].Intersection(unit_interval) && extents[i].IsValid() )
        {
          if ( extents[i].IsIncreasing() )
            continue;
          if ( extents[i].IsSingleton() )
            continue;
        }
      }

      rc = false;
      break;
    }

    if ( rc )
    {
      x_extents = extents[0];
      y_extents = extents[1];
    }
  }


  return rc;
}